

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

xmlChar * xmlValidNormalizeAttributeValue
                    (xmlDocPtr doc,xmlNodePtr elem,xmlChar *name,xmlChar *value)

{
  xmlChar *pxVar1;
  xmlNs *pxVar2;
  xmlChar *pxVar3;
  xmlAttributePtr pxVar4;
  xmlChar *pxVar5;
  xmlChar xVar6;
  xmlChar *pxVar7;
  xmlChar fn [50];
  xmlChar axStack_68 [64];
  
  if ((value != (xmlChar *)0x0 && name != (xmlChar *)0x0) &&
      (elem != (xmlNodePtr)0x0 && doc != (xmlDocPtr)0x0)) {
    pxVar2 = elem->ns;
    if ((pxVar2 != (xmlNs *)0x0) && (pxVar2->prefix != (xmlChar *)0x0)) {
      pxVar3 = xmlBuildQName(elem->name,pxVar2->prefix,axStack_68,0x32);
      if (pxVar3 == (xmlChar *)0x0) {
        return (xmlChar *)0x0;
      }
      if ((pxVar3 != axStack_68) && (pxVar3 != elem->name)) {
        (*xmlFree)(pxVar3);
      }
    }
    pxVar4 = xmlGetDtdAttrDesc(doc->intSubset,elem->name,name);
    if (pxVar4 == (xmlAttributePtr)0x0) {
      if (doc->extSubset == (xmlDtdPtr)0x0) {
        pxVar4 = (xmlAttributePtr)0x0;
      }
      else {
        pxVar4 = xmlGetDtdAttrDesc(doc->extSubset,elem->name,name);
      }
    }
    if (((pxVar4 != (xmlAttributePtr)0x0) && (pxVar4->atype != XML_ATTRIBUTE_CDATA)) &&
       (pxVar3 = xmlStrdup(value), pxVar3 != (xmlChar *)0x0)) {
      pxVar7 = value + -1;
      do {
        pxVar1 = pxVar7 + 1;
        pxVar7 = pxVar7 + 1;
        pxVar5 = pxVar3;
      } while (*pxVar1 == ' ');
LAB_00196883:
      xVar6 = *pxVar7;
      if (xVar6 == ' ') goto LAB_00196897;
      if (xVar6 == '\0') {
        *pxVar5 = '\0';
        return pxVar3;
      }
      pxVar7 = pxVar7 + 1;
      goto LAB_001968a5;
    }
  }
  return (xmlChar *)0x0;
LAB_00196897:
  for (; *pxVar7 == ' '; pxVar7 = pxVar7 + 1) {
  }
  if (*pxVar7 != '\0') {
    xVar6 = ' ';
LAB_001968a5:
    *pxVar5 = xVar6;
    pxVar5 = pxVar5 + 1;
  }
  goto LAB_00196883;
}

Assistant:

xmlChar *
xmlValidNormalizeAttributeValue(xmlDocPtr doc, xmlNodePtr elem,
			        const xmlChar *name, const xmlChar *value) {
    xmlChar *ret, *dst;
    const xmlChar *src;
    xmlAttributePtr attrDecl = NULL;

    if (doc == NULL) return(NULL);
    if (elem == NULL) return(NULL);
    if (name == NULL) return(NULL);
    if (value == NULL) return(NULL);

    if ((elem->ns != NULL) && (elem->ns->prefix != NULL)) {
	xmlChar fn[50];
	xmlChar *fullname;

	fullname = xmlBuildQName(elem->name, elem->ns->prefix, fn, 50);
	if (fullname == NULL)
	    return(NULL);
	if ((fullname != fn) && (fullname != elem->name))
	    xmlFree(fullname);
    }
    attrDecl = xmlGetDtdAttrDesc(doc->intSubset, elem->name, name);
    if ((attrDecl == NULL) && (doc->extSubset != NULL))
	attrDecl = xmlGetDtdAttrDesc(doc->extSubset, elem->name, name);

    if (attrDecl == NULL)
	return(NULL);
    if (attrDecl->atype == XML_ATTRIBUTE_CDATA)
	return(NULL);

    ret = xmlStrdup(value);
    if (ret == NULL)
	return(NULL);
    src = value;
    dst = ret;
    while (*src == 0x20) src++;
    while (*src != 0) {
	if (*src == 0x20) {
	    while (*src == 0x20) src++;
	    if (*src != 0)
		*dst++ = 0x20;
	} else {
	    *dst++ = *src++;
	}
    }
    *dst = 0;
    return(ret);
}